

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O0

void * ibuf_reserve(ibuf *buf,size_t len)

{
  int iVar1;
  ibuf *in_RSI;
  long in_RDI;
  void *b;
  size_t in_stack_ffffffffffffffe0;
  void *local_8;
  
  if ((*(ulong *)(in_RDI + 0x18) <
       (ulong)((long)&(in_RSI->entry).tqe_next + *(long *)(in_RDI + 0x28))) &&
     (iVar1 = ibuf_realloc(in_RSI,in_stack_ffffffffffffffe0), iVar1 == -1)) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x28));
    *(long *)(in_RDI + 0x28) = (long)&(in_RSI->entry).tqe_next + *(long *)(in_RDI + 0x28);
  }
  return local_8;
}

Assistant:

void *
ibuf_reserve(struct ibuf *buf, size_t len)
{
	void	*b;

	if (buf->wpos + len > buf->size)
		if (ibuf_realloc(buf, len) == -1)
			return (NULL);

	b = buf->buf + buf->wpos;
	buf->wpos += len;
	return (b);
}